

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
               *src,assign_op<double,_double> *func)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  NestedExpressionType pMVar5;
  double *pdVar6;
  ulong cols;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Index index;
  ulong uVar15;
  double dVar16;
  double dVar20;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  
  dVar2 = (src->m_expression).m_lhs.m_functor.m_other;
  dVar3 = (src->m_expression).m_rhs.m_lhs.m_functor.m_other;
  dVar4 = (src->m_expression).m_rhs.m_rhs.m_xpr.m_lhs.m_functor.m_other;
  pMVar5 = (src->m_expression).m_rhs.m_rhs.m_xpr.m_rhs.m_expression;
  pdVar6 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  uVar15 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  cols = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar15) ||
     (uVar10 = cols, uVar12 = uVar15,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    if ((long)(cols | uVar15) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar15 != 0) &&
       (auVar22 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar22 / SEXT816((long)cols),0) < (long)uVar15)) {
      puVar11 = (undefined8 *)
                __cxa_allocate_exception(8,src,SUB168(auVar22 % SEXT816((long)cols),0));
      *puVar11 = std::random_device::_M_fini;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar15,uVar15,cols);
    uVar12 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
    uVar10 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
  }
  if ((uVar12 == uVar15) && (uVar10 == cols)) {
    pdVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar13 = cols * uVar15;
    uVar15 = lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar13) {
      lVar14 = 0;
      do {
        pdVar1 = pdVar6 + lVar14;
        dVar29 = *pdVar1;
        dVar30 = pdVar1[1];
        if (pexp<double__vector(2)>(double(int)const)::p4i_1023_0 == '\0') {
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const>const>const>,Eigen::internal::assign_op<double,double>>
                    ();
        }
        dVar29 = dVar29 * dVar4;
        dVar30 = dVar30 * dVar4;
        auVar21._8_8_ = dVar30;
        auVar21._0_8_ = dVar29;
        auVar22 = minpd(auVar21,_DAT_00114070);
        auVar9._8_8_ = 0xc0862b7d369a5715;
        auVar9._0_8_ = 0xc0862b7d369a5715;
        auVar22 = maxpd(auVar22,auVar9);
        dVar25 = auVar22._0_8_ * 1.4426950408889634 + 0.5;
        dVar26 = auVar22._8_8_ * 1.4426950408889634 + 0.5;
        dVar16 = (double)(int)dVar25;
        dVar20 = (double)(int)dVar26;
        dVar16 = dVar16 - (double)(-(ulong)(dVar25 < dVar16) & 0x3ff0000000000000);
        dVar20 = dVar20 - (double)(-(ulong)(dVar26 < dVar20) & 0x3ff0000000000000);
        dVar27 = dVar16 * -0.693145751953125 + auVar22._0_8_ + dVar16 * -1.4286068203094173e-06;
        dVar28 = dVar20 * -0.693145751953125 + auVar22._8_8_ + dVar20 * -1.4286068203094173e-06;
        dVar25 = dVar27 * dVar27;
        dVar26 = dVar28 * dVar28;
        auVar23._0_8_ =
             ((dVar25 * 0.00012617719307481058 + 0.030299440770744195) * dVar25 + 1.0) * dVar27;
        auVar23._8_8_ =
             ((dVar26 * 0.00012617719307481058 + 0.030299440770744195) * dVar26 + 1.0) * dVar28;
        auVar22._8_8_ =
             (((dVar26 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar26 +
              0.22726554820815503) * dVar26 + 2.0) - auVar23._8_8_;
        auVar22._0_8_ =
             (((dVar25 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar25 +
              0.22726554820815503) * dVar25 + 2.0) - auVar23._0_8_;
        auVar22 = divpd(auVar23,auVar22);
        auVar17._0_8_ =
             (double)CONCAT44(((int)dVar16 + pexp<double__vector(2)>(double(int)const)::p4i_1023_0)
                              * 0x100000,DAT_001222ec << 0x14);
        auVar17._8_4_ = DAT_001222e8 << 0x14;
        auVar17._12_4_ = ((int)dVar20 + DAT_001222e4) * 0x100000;
        auVar18._0_8_ = auVar17._0_8_ * (auVar22._0_8_ + auVar22._0_8_ + 1.0);
        auVar18._8_8_ = auVar17._8_8_ * (auVar22._8_8_ + auVar22._8_8_ + 1.0);
        auVar8._8_8_ = dVar30;
        auVar8._0_8_ = dVar29;
        auVar22 = maxpd(auVar18,auVar8);
        auVar19._0_8_ = auVar22._0_8_ + dVar3;
        auVar19._8_8_ = auVar22._8_8_ + dVar3;
        auVar24._8_8_ = dVar2;
        auVar24._0_8_ = dVar2;
        auVar22 = divpd(auVar24,auVar19);
        *(undefined1 (*) [16])(pdVar7 + lVar14) = auVar22;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar15);
    }
    if ((long)uVar15 < lVar13) {
      do {
        dVar29 = exp(pdVar6[uVar15] * dVar4);
        pdVar7[uVar15] = dVar2 / (dVar29 + dVar3);
        uVar15 = uVar15 + 1;
      } while (lVar13 - uVar15 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>>>>>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}